

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

WhileLoopStatement * __thiscall
slang::BumpAllocator::
emplace<slang::ast::WhileLoopStatement,slang::ast::Expression_const&,slang::ast::Statement_const&,slang::SourceRange>
          (BumpAllocator *this,Expression *args,Statement *args_1,SourceRange *args_2)

{
  SourceLocation SVar1;
  SourceLocation SVar2;
  WhileLoopStatement *pWVar3;
  
  pWVar3 = (WhileLoopStatement *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((WhileLoopStatement *)this->endPtr < pWVar3 + 1) {
    pWVar3 = (WhileLoopStatement *)allocateSlow(this,0x30,8);
  }
  else {
    this->head->current = (byte *)(pWVar3 + 1);
  }
  SVar1 = args_2->startLoc;
  SVar2 = args_2->endLoc;
  (pWVar3->super_Statement).kind = WhileLoop;
  (pWVar3->super_Statement).syntax = (StatementSyntax *)0x0;
  (pWVar3->super_Statement).sourceRange.startLoc = SVar1;
  (pWVar3->super_Statement).sourceRange.endLoc = SVar2;
  pWVar3->cond = args;
  pWVar3->body = args_1;
  return pWVar3;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }